

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O0

void __thiscall
ON_PostEffect::CImpl::SetPropertyValue(CImpl *this,wchar_t *name,ON_XMLVariant *value)

{
  ON_XMLNode *pOVar1;
  ON_wString local_98;
  ON_XMLProperty local_90;
  ON_XMLNode *local_28;
  ON_XMLNode *pep_node;
  ON_XMLVariant *value_local;
  wchar_t *name_local;
  CImpl *this_local;
  
  pep_node = (ON_XMLNode *)value;
  value_local = (ON_XMLVariant *)name;
  name_local = (wchar_t *)this;
  pOVar1 = PepNode(this);
  if (pOVar1 != (ON_XMLNode *)0x0) {
    local_28 = pOVar1;
    ON_wString::ON_wString(&local_98,(wchar_t *)value_local);
    ON_XMLProperty::ON_XMLProperty(&local_90,&local_98,(ON_XMLVariant *)pep_node);
    (*pOVar1->_vptr_ON_XMLNode[0xd])(pOVar1,&local_90);
    ON_XMLProperty::~ON_XMLProperty(&local_90);
    ON_wString::~ON_wString(&local_98);
  }
  return;
}

Assistant:

void ON_PostEffect::CImpl::SetPropertyValue(const wchar_t* name, const ON_XMLVariant& value) const
{
  auto* pep_node = PepNode();
  if (nullptr != pep_node)
  {
    pep_node->SetProperty(ON_XMLProperty(name, value));
  }
}